

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O1

bool __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::haveConflictingRelation
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *lt,Type type,Bucket *rt,
          Relations *maybeBetween)

{
  pointer prVar1;
  _Base_bitset<1UL> _Var2;
  ulong uVar3;
  Bucket *rt_00;
  
  while (rt_00 = rt, type == PF) {
    type = dg::vr::Relations::inverted(PF);
    maybeBetween = (Relations *)0x0;
    rt = lt;
    lt = rt_00;
  }
  if (type < PT) {
    if (maybeBetween == (Relations *)0x0) {
      _Var2._M_w = (_WordT)relationsBetween(this,lt,rt_00);
    }
    else {
      _Var2._M_w = (maybeBetween->bits).super__Base_bitset<1UL>._M_w;
    }
  }
  else {
    if (type != PT) {
      abort();
    }
    prVar1 = (lt->relatedBuckets)._M_elems[10].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (prVar1 == (lt->relatedBuckets)._M_elems[10].vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    _Var2._M_w = (_WordT)relationsBetween(this,prVar1->_M_data,rt_00);
    type = EQ;
  }
  uVar3 = dg::vr::Relations::conflicting(type);
  return (uVar3 & _Var2._M_w) != 0;
}

Assistant:

bool haveConflictingRelation(const Bucket &lt, Relations::Type type,
                                 const Bucket &rt,
                                 Relations *maybeBetween = nullptr) const {
        switch (type) {
        case Relations::EQ:
        case Relations::NE:
        case Relations::SLT:
        case Relations::SLE:
        case Relations::ULT:
        case Relations::ULE:
        case Relations::SGT:
        case Relations::SGE:
        case Relations::UGT:
        case Relations::UGE: {
            Relations between = fromMaybeBetween(lt, rt, maybeBetween);
            return between.conflictsWith(type);
        }
        case Relations::PT:
            return lt.hasRelation(type) &&
                   haveConflictingRelation(lt.getRelated(type), Relations::EQ,
                                           rt);
        case Relations::PF:
            return haveConflictingRelation(rt, Relations::inverted(type), lt);
        }
        assert(0 && "unreachable");
        abort();
    }